

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlquery.cpp
# Opt level: O0

size_t qHash(QUrlQuery *key,size_t seed)

{
  QUrlQueryPrivate *pQVar1;
  result_type in_RSI;
  long in_FS_OFFSET;
  QUrlQueryPrivate *d;
  QHashCombine hash;
  QList<std::pair<QString,_QString>_> *in_stack_ffffffffffffffc0;
  undefined1 *seed_00;
  QHashCombine *in_stack_ffffffffffffffd0;
  result_type local_20;
  undefined1 local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = QSharedDataPointer::operator_cast_to_QUrlQueryPrivate_
                     ((QSharedDataPointer<QUrlQueryPrivate> *)0x313f7a);
  local_20 = in_RSI;
  if (pQVar1 != (QUrlQueryPrivate *)0x0) {
    local_9 = 0xaa;
    seed_00 = &local_9;
    QtPrivate::QHashCombine::operator()
              (in_stack_ffffffffffffffd0,(size_t)seed_00,(QChar *)in_stack_ffffffffffffffc0);
    QtPrivate::QHashCombine::operator()
              (in_stack_ffffffffffffffd0,(size_t)seed_00,(QChar *)in_stack_ffffffffffffffc0);
    local_20 = QtPrivate::QHashCombine::operator()
                         (in_stack_ffffffffffffffd0,(size_t)seed_00,in_stack_ffffffffffffffc0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_20;
  }
  __stack_chk_fail();
}

Assistant:

size_t qHash(const QUrlQuery &key, size_t seed) noexcept
{
    if (const QUrlQueryPrivate *d = key.d) {
        QtPrivate::QHashCombine hash;
        // keep in sync with operator==:
        seed = hash(seed, d->valueDelimiter);
        seed = hash(seed, d->pairDelimiter);
        seed = hash(seed, d->itemList);
    }
    return seed;
}